

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O1

SimpleString HexStringFrom(char value)

{
  long lVar1;
  size_t sVar2;
  size_t extraout_RDX;
  uint in_ESI;
  undefined7 in_register_00000039;
  SimpleString *this;
  SimpleString SVar3;
  SimpleString SStack_28;
  
  this = (SimpleString *)CONCAT71(in_register_00000039,value);
  SVar3 = StringFromFormat((char *)this,"%x",(ulong)in_ESI);
  sVar2 = SVar3.bufferSize_;
  if ((char)in_ESI < '\0') {
    sVar2 = 0xfffffffffffffffd;
    do {
      lVar1 = sVar2 + 3;
      sVar2 = sVar2 + 1;
    } while (this->buffer_[lVar1] != '\0');
    SimpleString::subString(&SStack_28,(size_t)this,sVar2);
    SimpleString::copyBufferToNewInternalBuffer(this,&SStack_28);
    SimpleString::deallocateInternalBuffer(&SStack_28);
    sVar2 = extraout_RDX;
  }
  SVar3.bufferSize_ = sVar2;
  SVar3.buffer_ = (char *)this;
  return SVar3;
}

Assistant:

SimpleString HexStringFrom(signed char value)
{
    SimpleString result = StringFromFormat("%x", value);
    if(value < 0) {
        size_t size = result.size();
        result = result.subString(size-(CPPUTEST_CHAR_BIT/4));
    }
    return result;
}